

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CountDownLatch.cpp
# Opt level: O1

int __thiscall sznet::CountDownLatch::getCount(CountDownLatch *this)

{
  MutexLock *mutex;
  int iVar1;
  
  mutex = &this->m_mutex;
  sz_mutex_lock(&mutex->m_mutex);
  MutexLock::assignHolder(mutex);
  iVar1 = this->m_count;
  (this->m_mutex).m_holder = 0;
  sz_mutex_unlock(&mutex->m_mutex);
  return iVar1;
}

Assistant:

int CountDownLatch::getCount() const
{
	MutexLockGuard lock(m_mutex);
	return m_count;
}